

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.h
# Opt level: O3

void __thiscall
wallet::CWallet::
WalletLogPrintf<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,unsigned_int>
          (CWallet *this,char *fmt,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters_3,
          uint parameters_4)

{
  tinyformat *ptVar1;
  string_view source_file;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  Logger *pLVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  undefined4 in_register_00000014;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  tinyformat *this_00;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  string log_msg;
  uint *in_stack_fffffffffffffea8;
  allocator<char> local_13a [2];
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  tinyformat *local_f8;
  size_type local_f0;
  size_type local_e8;
  undefined8 uStack_e0;
  undefined8 local_98;
  char *pcStack_90;
  string local_78;
  char *local_58;
  size_t local_50;
  char local_48;
  undefined7 uStack_47;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,fmt,local_13a);
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_118,0,0,"%s ",3);
  this_00 = (tinyformat *)&local_e8;
  ptVar1 = (tinyformat *)(pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if (ptVar1 == (tinyformat *)paVar5) {
    local_e8 = paVar5->_M_allocated_capacity;
    uStack_e0 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_e8 = paVar5->_M_allocated_capacity;
    this_00 = ptVar1;
  }
  local_f0 = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  local_f8 = this_00;
  GetDisplayName_abi_cxx11_(&local_138,this);
  pLVar4 = LogInstance();
  bVar2 = BCLog::Logger::Enabled(pLVar4);
  if (bVar2) {
    local_50 = 0;
    local_48 = '\0';
    local_58 = &local_48;
    tinyformat::
    format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,unsigned_int>
              (&local_78,this_00,(char *)&local_138,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_register_00000014,parameters_4),in_RCX,in_R8,in_R9,&parameters,
               in_stack_fffffffffffffea8);
    WalletLogPrintf<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,unsigned_int>
              ();
    pLVar4 = LogInstance();
    local_98 = 0x58;
    pcStack_90 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h";
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h";
    source_file._M_len = 0x58;
    str._M_str = local_58;
    str._M_len = local_50;
    logging_function._M_str = "WalletLogPrintf";
    logging_function._M_len = 0xf;
    BCLog::Logger::LogPrintStr(pLVar4,str,logging_function,source_file,0x3a4,ALL,Info);
    if (local_58 != &local_48) {
      operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if (local_f8 != (tinyformat *)&local_e8) {
    operator_delete(local_f8,local_e8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WalletLogPrintf(const char* fmt, Params... parameters) const
    {
        LogPrintf(("%s " + std::string{fmt}).c_str(), GetDisplayName(), parameters...);
    }